

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::PoolingLayerParams::PoolingLayerParams
          (PoolingLayerParams *this,PoolingLayerParams *from)

{
  PoolingPaddingTypeCase PVar1;
  InternalMetadataWithArenaLite *this_00;
  ValidPadding *this_01;
  ValidPadding *from_00;
  SamePadding *this_02;
  SamePadding *from_01;
  PoolingLayerParams_ValidCompletePadding *this_03;
  PoolingLayerParams_ValidCompletePadding *from_02;
  PoolingLayerParams *from_local;
  PoolingLayerParams *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PoolingLayerParams_00627c30;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField
            (&this->kernelsize_,&from->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->stride_,&from->stride_);
  PoolingPaddingTypeUnion::PoolingPaddingTypeUnion
            ((PoolingPaddingTypeUnion *)&this->PoolingPaddingType_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  memcpy(&this->type_,&from->type_,(long)this + (0x42 - (long)&this->type_));
  clear_has_PoolingPaddingType(this);
  PVar1 = PoolingPaddingType_case(from);
  switch(PVar1) {
  case POOLINGPADDINGTYPE_NOT_SET:
    break;
  case kValid:
    this_01 = mutable_valid(this);
    from_00 = valid(from);
    ValidPadding::MergeFrom(this_01,from_00);
    break;
  case kSame:
    this_02 = mutable_same(this);
    from_01 = same(from);
    SamePadding::MergeFrom(this_02,from_01);
    break;
  case kIncludeLastPixel:
    this_03 = mutable_includelastpixel(this);
    from_02 = includelastpixel(from);
    PoolingLayerParams_ValidCompletePadding::MergeFrom(this_03,from_02);
  }
  return;
}

Assistant:

PoolingLayerParams::PoolingLayerParams(const PoolingLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&type_, &from.type_,
    reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_) + sizeof(globalpooling_));
  clear_has_PoolingPaddingType();
  switch (from.PoolingPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case kIncludeLastPixel: {
      mutable_includelastpixel()->::CoreML::Specification::PoolingLayerParams_ValidCompletePadding::MergeFrom(from.includelastpixel());
      break;
    }
    case POOLINGPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PoolingLayerParams)
}